

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode cf_he_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  long *plVar2;
  curl_trc_feat *pcVar3;
  uint uVar4;
  int iVar5;
  CURLcode CVar6;
  long lVar7;
  uint uVar8;
  curltime *when;
  bool bVar9;
  bool bVar10;
  curltime cVar11;
  int breply_ms;
  uint local_3c;
  uint *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pCVar1 = (Curl_cfilter *)cf->ctx;
    if (query == 5) {
      iVar5 = 5;
    }
    else {
      if (query != 4) {
        if (query == 2) {
          uVar8 = 0xffffffff;
          lVar7 = 0;
          bVar10 = true;
          local_38 = (uint *)pres1;
          do {
            bVar9 = bVar10;
            lVar7 = *(long *)(&pCVar1->sockindex + lVar7 * 2);
            if (((lVar7 != 0) && (plVar2 = *(long **)(lVar7 + 0x28), plVar2 != (long *)0x0)) &&
               (iVar5 = (**(code **)(*plVar2 + 0x70))(plVar2,data,2,&local_3c,0),
               -1 < (int)local_3c && iVar5 == 0)) {
              uVar4 = uVar8;
              if ((int)local_3c < (int)uVar8) {
                uVar4 = local_3c;
              }
              bVar10 = (int)uVar8 < 0;
              uVar8 = uVar4;
              if (bVar10) {
                uVar8 = local_3c;
              }
            }
            lVar7 = 1;
            bVar10 = false;
          } while (bVar9);
          *local_38 = uVar8;
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar3 = (data->state).feat;
          if (pcVar3 == (curl_trc_feat *)0x0) {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_OK;
            }
          }
          else {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_OK;
            }
            if (pcVar3->log_level < 1) {
              return CURLE_OK;
            }
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          Curl_trc_cf_infof(data,cf,"query connect reply: %dms",(ulong)uVar8);
          return CURLE_OK;
        }
        goto LAB_0011be04;
      }
      iVar5 = 4;
    }
    cVar11 = get_max_baller_time(pCVar1,data,iVar5);
    *(time_t *)pres2 = cVar11.tv_sec;
    *(int *)((long)pres2 + 8) = cVar11.tv_usec;
    CVar6 = CURLE_OK;
  }
  else {
LAB_0011be04:
    pCVar1 = cf->next;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      CVar6 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
      return CVar6;
    }
    CVar6 = CURLE_UNKNOWN_OPTION;
  }
  return CVar6;
}

Assistant:

static CURLcode cf_he_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_he_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_CONNECT_REPLY_MS: {
      int reply_ms = -1;
      size_t i;

      for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
        struct eyeballer *baller = ctx->baller[i];
        int breply_ms;

        if(baller && baller->cf &&
           !baller->cf->cft->query(baller->cf, data, query,
                                   &breply_ms, NULL)) {
          if(breply_ms >= 0 && (reply_ms < 0 || breply_ms < reply_ms))
            reply_ms = breply_ms;
        }
      }
      *pres1 = reply_ms;
      CURL_TRC_CF(data, cf, "query connect reply: %dms", *pres1);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }

  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}